

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O3

Value * __thiscall
minja::IfExpr::do_evaluate
          (Value *__return_storage_ptr__,IfExpr *this,shared_ptr<minja::Context> *context)

{
  _Atomic_word *p_Var1;
  Expression *this_00;
  bool bVar2;
  int iVar3;
  runtime_error *this_01;
  element_type *this_02;
  Value VStack_78;
  
  this_00 = (this->condition).super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  if (this_00 == (Expression *)0x0) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"IfExpr.condition is null");
  }
  else {
    if ((this->then_expr).super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        != (element_type *)0x0) {
      Expression::evaluate(&VStack_78,this_00,context);
      bVar2 = Value::to_bool(&VStack_78);
      nlohmann::json_abi_v3_11_3::
      basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::assert_invariant(&VStack_78.primitive_,false);
      nlohmann::json_abi_v3_11_3::
      basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&VStack_78.primitive_.m_data);
      if (VStack_78.callable_.
          super___shared_ptr<std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (VStack_78.callable_.
                   super___shared_ptr<std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (VStack_78.object_.
          super___shared_ptr<nlohmann::json_abi_v3_11_3::ordered_map<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value,_std::less<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::allocator<std::pair<const_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value>_>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (VStack_78.object_.
                   super___shared_ptr<nlohmann::json_abi_v3_11_3::ordered_map<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value,_std::less<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::allocator<std::pair<const_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value>_>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (VStack_78.array_.
          super___shared_ptr<std::vector<minja::Value,_std::allocator<minja::Value>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (VStack_78.array_.
                   super___shared_ptr<std::vector<minja::Value,_std::allocator<minja::Value>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (VStack_78.super_enable_shared_from_this<minja::Value>._M_weak_this.
          super___weak_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1 = &(VStack_78.super_enable_shared_from_this<minja::Value>._M_weak_this.
                     super___weak_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                    _M_weak_count;
          iVar3 = *p_Var1;
          *p_Var1 = *p_Var1 + -1;
          UNLOCK();
        }
        else {
          iVar3 = (VStack_78.super_enable_shared_from_this<minja::Value>._M_weak_this.
                   super___weak_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                  _M_weak_count;
          (VStack_78.super_enable_shared_from_this<minja::Value>._M_weak_this.
           super___weak_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_weak_count = iVar3 + -1;
        }
        if (iVar3 == 1) {
          (*(VStack_78.super_enable_shared_from_this<minja::Value>._M_weak_this.
             super___weak_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _vptr__Sp_counted_base[3])();
        }
      }
      if (bVar2) {
        this_02 = (this->then_expr).
                  super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      }
      else {
        this_02 = (this->else_expr).
                  super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (this_02 == (element_type *)0x0) {
          (__return_storage_ptr__->primitive_).m_data.m_value.object = (object_t *)0x0;
          (__return_storage_ptr__->super_enable_shared_from_this<minja::Value>)._M_weak_this.
          super___weak_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
          (__return_storage_ptr__->super_enable_shared_from_this<minja::Value>)._M_weak_this.
          super___weak_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          (__return_storage_ptr__->array_).
          super___shared_ptr<std::vector<minja::Value,_std::allocator<minja::Value>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          (__return_storage_ptr__->array_).
          super___shared_ptr<std::vector<minja::Value,_std::allocator<minja::Value>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          (__return_storage_ptr__->object_).
          super___shared_ptr<nlohmann::json_abi_v3_11_3::ordered_map<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value,_std::less<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::allocator<std::pair<const_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value>_>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          (__return_storage_ptr__->object_).
          super___shared_ptr<nlohmann::json_abi_v3_11_3::ordered_map<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value,_std::less<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::allocator<std::pair<const_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value>_>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          (__return_storage_ptr__->callable_).
          super___shared_ptr<std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          (__return_storage_ptr__->callable_).
          super___shared_ptr<std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          (__return_storage_ptr__->primitive_).m_data.m_type = null;
          nlohmann::json_abi_v3_11_3::
          basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::assert_invariant(&__return_storage_ptr__->primitive_,true);
          nlohmann::json_abi_v3_11_3::
          basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::assert_invariant(&__return_storage_ptr__->primitive_,true);
          return __return_storage_ptr__;
        }
      }
      Expression::evaluate(__return_storage_ptr__,this_02,context);
      return __return_storage_ptr__;
    }
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"IfExpr.then_expr is null");
  }
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Value do_evaluate(const std::shared_ptr<Context> & context) const override {
      if (!condition) throw std::runtime_error("IfExpr.condition is null");
      if (!then_expr) throw std::runtime_error("IfExpr.then_expr is null");
      if (condition->evaluate(context).to_bool()) {
        return then_expr->evaluate(context);
      }
      if (else_expr) {
        return else_expr->evaluate(context);
      }
      return nullptr;
    }